

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::LetDeclarationSyntax::setChild
          (LetDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0048db54 + *(int *)(&DAT_0048db54 + index * 4)))();
  return;
}

Assistant:

void LetDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: let = child.token(); return;
        case 2: identifier = child.token(); return;
        case 3: portList = child.node() ? &child.node()->as<AssertionItemPortListSyntax>() : nullptr; return;
        case 4: equals = child.token(); return;
        case 5: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 6: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}